

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Planets.cpp
# Opt level: O2

void __thiscall Planets::LoadPlanets(Planets *this,string *filename)

{
  pointer pbVar1;
  element_type *peVar2;
  int x;
  int y;
  int z;
  _Base_ptr p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  shared_ptr<Node> planet_node;
  __shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2> local_1e8;
  shared_ptr<Planet> planet;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  coords_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  string coords;
  string planet_id;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  children;
  string local_120;
  string local_100;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>
  child;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string planet_name;
  
  std::__cxx11::string::string((string *)&local_100,(string *)filename);
  SkexmlParser::Parse((SkexmlParser *)&planet_node,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  ::_Rb_tree(&children._M_t,
             &((planet_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_children)
              ._M_t);
  for (p_Var3 = children._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &children._M_t._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>
    ::pair(&child,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>
                   *)(p_Var3 + 1));
    std::__cxx11::string::string((string *)&planet_name,(string *)&child);
    peVar2 = child.second.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string((string *)&local_70,"ID",(allocator *)&coords);
    Node::GetAttribute(&planet_id,peVar2,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    peVar2 = child.second.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__cxx11::string::string((string *)&local_90,"Coordinates",(allocator *)&local_1b0);
    Node::GetAttribute(&coords,peVar2,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_120,(string *)&coords);
    Tokenizer::GetAllTokens(&coords_list,&local_120,',');
    std::__cxx11::string::~string((string *)&local_120);
    x = atoi(planet_id._M_dataplus._M_p);
    __return_storage_ptr__ = &local_1b0;
    std::operator+(__return_storage_ptr__,&GameData::PLANET_PATH_abi_cxx11_,&planet_name);
    std::operator+(&local_b0,__return_storage_ptr__,".sml");
    pbVar1 = coords_list.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    y = atoi(((coords_list.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    z = atoi(pbVar1[1]._M_dataplus._M_p);
    atoi(pbVar1[2]._M_dataplus._M_p);
    BuildPlanet((Planets *)&planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>,
                __return_storage_ptr__,(int)&local_b0,x,y,z);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_1e8,&planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>);
    AddPlanet(this,(shared_ptr<Planet> *)&local_1e8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1e8._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&planet.super___shared_ptr<Planet,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&coords_list);
    std::__cxx11::string::~string((string *)&coords);
    std::__cxx11::string::~string((string *)&planet_id);
    std::__cxx11::string::~string((string *)&planet_name);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>
    ::~pair(&child);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Node>_>_>_>
  ::~_Rb_tree(&children._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&planet_node.super___shared_ptr<Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void Planets::LoadPlanets(std::string filename) {
    std::shared_ptr<Node> planet_node = SkexmlParser::Parse(filename);
    auto children = planet_node->GetChildren();
    for(auto child : children)
    {
        std::string planet_name = child.first;
        std::string planet_id = child.second->GetAttribute("ID");
        std::string coords = child.second->GetAttribute("Coordinates");
        auto coords_list = Tokenizer::GetAllTokens(coords, ',');
        int id = atoi(planet_id.c_str());
        std::shared_ptr<Planet> planet = BuildPlanet(GameData::PLANET_PATH + planet_name + ".sml", id,
                                                     atoi(coords_list[0].c_str()),
                                                     atoi(coords_list[1].c_str()),
                                                     atoi(coords_list[2].c_str()));

        AddPlanet(planet);
    }
}